

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int alloc_addbyter(int output,FILE *data)

{
  CURLcode CVar1;
  uint uVar2;
  uchar outc;
  
  outc = (uchar)output;
  CVar1 = Curl_dyn_addn(*(dynbuf **)data,&outc,1);
  if (CVar1 == CURLE_OK) {
    uVar2 = (uint)outc;
  }
  else {
    *(undefined1 *)&data->_IO_read_ptr = 1;
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

static int alloc_addbyter(int output, FILE *data)
{
  struct asprintf *infop = (struct asprintf *)data;
  unsigned char outc = (unsigned char)output;

  if(Curl_dyn_addn(infop->b, &outc, 1)) {
    infop->fail = 1;
    return -1; /* fail */
  }
  return outc; /* fputc() returns like this on success */
}